

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void discordpp::from_json(json *j,Interaction *t)

{
  const_iterator cVar1;
  const_reference pvVar2;
  InteractionType *pIVar3;
  runtime_error *this;
  field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  local_270;
  undefined1 local_260 [144];
  __uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> local_1d0;
  unique_ptr<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
  local_1c0 [16];
  _Variant_storage<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
  local_140;
  
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[3],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [3])0x1f0c93),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[3],_0>(j,(char (*) [3])0x1f0c93);
    from_json(pvVar2,&t->id);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[15],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [15])0x1f0c56),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[15],_0>(j,(char (*) [15])0x1f0c56);
    from_json(pvVar2,&t->application_id);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[5],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [5])0x1eccba),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1eccba);
    from_json(pvVar2,&t->type);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[5],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [5])0x1eadba),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pIVar3 = field<discordpp::InteractionType>::operator*(&t->type);
    switch(*pIVar3) {
    case APPLICATION_COMMAND:
    case APPLICATION_COMMAND_AUTOCOMPLETE:
      pvVar2 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1eadba);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<discordpp::ApplicationCommandData,_0>((ApplicationCommandData *)local_260,pvVar2);
      ApplicationCommandData::ApplicationCommandData
                ((ApplicationCommandData *)&local_140,(ApplicationCommandData *)local_260);
      local_140._M_index = '\0';
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::field(&local_270,
              (variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
               *)&local_140);
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::operator=(&(t->data).
                   super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                  ,&local_270);
      std::
      unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
      ::~unique_ptr(&local_270.t_);
      std::__detail::__variant::
      _Variant_storage<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
      ::~_Variant_storage(&local_140);
      ApplicationCommandData::~ApplicationCommandData((ApplicationCommandData *)local_260);
      break;
    case MESSAGE_COMPONENT:
      pvVar2 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1eadba);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<discordpp::MessageComponentData,_0>((MessageComponentData *)local_260,pvVar2);
      MessageComponentData::MessageComponentData
                ((MessageComponentData *)&local_140,(MessageComponentData *)local_260);
      local_140._M_index = '\x01';
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::field(&local_270,
              (variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
               *)&local_140);
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::operator=(&(t->data).
                   super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                  ,&local_270);
      std::
      unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
      ::~unique_ptr(&local_270.t_);
      std::__detail::__variant::
      _Variant_storage<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
      ::~_Variant_storage(&local_140);
      MessageComponentData::~MessageComponentData((MessageComponentData *)local_260);
      break;
    case MODAL_SUBMIT:
      pvVar2 = nlohmann::json_abi_v3_11_2::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1eadba);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::get_impl<discordpp::ModalSubmitData,_0>(local_260,pvVar2);
      std::__detail::__variant::_Uninitialized<discordpp::ModalSubmitData,_false>::
      _Uninitialized<discordpp::ModalSubmitData>
                ((_Uninitialized<discordpp::ModalSubmitData,_false> *)&local_140,local_260);
      local_140._M_index = '\x02';
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::field(&local_270,
              (variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
               *)&local_140);
      field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
      ::operator=(&(t->data).
                   super_field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                  ,&local_270);
      std::
      unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
      ::~unique_ptr(&local_270.t_);
      std::__detail::__variant::
      _Variant_storage<false,_discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
      ::~_Variant_storage(&local_140);
      std::
      unique_ptr<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>,_std::default_delete<std::vector<discordpp::Component,_std::allocator<discordpp::Component>_>_>_>
      ::~unique_ptr(local_1c0);
      if ((_Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)
          local_1d0._M_t.
          super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
          .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl != (Snowflake *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1d0._M_t.
                     super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>
                     .super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl);
      }
      local_1d0._M_t.
      super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
      super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
           (tuple<discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)
           (_Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)0x0
      ;
      std::
      unique_ptr<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Attachment,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Attachment>_>_>_>_>
                     *)(local_260 + 0x80));
      std::
      unique_ptr<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Message,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Message>_>_>_>_>
                     *)(local_260 + 0x68));
      std::
      unique_ptr<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Channel,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Channel>_>_>_>_>
                     *)(local_260 + 0x50));
      std::
      unique_ptr<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::Role,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::Role>_>_>_>_>
                     *)(local_260 + 0x38));
      std::
      unique_ptr<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::GuildMember,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::GuildMember>_>_>_>_>
                     *)(local_260 + 0x20));
      std::
      unique_ptr<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
      ::~unique_ptr((unique_ptr<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>,_std::default_delete<std::map<discordpp::Snowflake,_discordpp::User,_std::less<discordpp::Snowflake>,_std::allocator<std::pair<const_discordpp::Snowflake,_discordpp::User>_>_>_>_>
                     *)(local_260 + 8));
      break;
    default:
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown interaction type");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[9],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [9])0x1f0c8d),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[9],_0>(j,(char (*) [9])0x1f0c8d);
    from_json(pvVar2,&(t->guild_id).super_field<discordpp::Snowflake>);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[11],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [11])0x1edaa8),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[11],_0>(j,(char (*) [11])0x1edaa8);
    from_json(pvVar2,&(t->channel_id).super_field<discordpp::Snowflake>);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[7],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [7])"member"),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[7],_0>(j,(char (*) [7])"member");
    from_json(pvVar2,&(t->member).super_field<discordpp::GuildMember>);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[5],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [5])0x1ece9d),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[5],_0>(j,(char (*) [5])0x1ece9d);
    from_json(pvVar2,&(t->user).super_field<discordpp::User>);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[6],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [6])0x1f02e1),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[6],_0>(j,(char (*) [6])0x1f02e1);
    from_json(pvVar2,&t->token);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[8],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [8])"version"),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[8],_0>(j,(char (*) [8])"version");
    from_json(pvVar2,&t->version);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[8],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [8])0x1ecfc6),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[8],_0>(j,(char (*) [8])0x1ecfc6);
    from_json(pvVar2,&(t->message).super_field<discordpp::Message>);
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[16],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [16])"app_permissions"),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[16],_0>(j,(char (*) [16])"app_permissions");
    from_json(pvVar2,&(t->app_permissions).
                      super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[7],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [7])0x1eb455),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[7],_0>(j,(char (*) [7])0x1eb455);
    from_json(pvVar2,&(t->locale).
                      super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  }
  if ((j->m_type == object) &&
     (cVar1 = std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ::_M_find_tr<char[13],void>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                          *)(j->m_value).object,(char (*) [13])"guild_locale"),
     (_Rb_tree_header *)cVar1._M_node !=
     &(((j->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
    pvVar2 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at<const_char_(&)[13],_0>(j,(char (*) [13])"guild_locale");
    from_json(pvVar2,&(t->guild_locale).
                      super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
  }
  return;
}

Assistant:

void from_json(const nlohmann::json &j, Interaction &t) {
        if(j.contains("id")){j.at("id").get_to(t.id);}
        if(j.contains("application_id")){j.at("application_id").get_to(t.application_id);}
        if(j.contains("type")){j.at("type").get_to(t.type);}
        if(j.contains("data")){
            switch(*t.type) {
            case InteractionType::APPLICATION_COMMAND:
            case InteractionType::APPLICATION_COMMAND_AUTOCOMPLETE:
                t.data = std::variant<ApplicationCommandData, MessageComponentData, ModalSubmitData>(
                    j.at("data").get<ApplicationCommandData>()
                );
                break;
            case InteractionType::MESSAGE_COMPONENT:
                t.data = std::variant<ApplicationCommandData, MessageComponentData, ModalSubmitData>(
                    j.at("data").get<MessageComponentData>()
                );
                break;
            case InteractionType::MODAL_SUBMIT:
                t.data = std::variant<ApplicationCommandData, MessageComponentData, ModalSubmitData>(
                    j.at("data").get<ModalSubmitData>()
                );
                break;
            default:
                throw std::runtime_error("Unknown interaction type");
            }
        }
        if(j.contains("guild_id")){j.at("guild_id").get_to(t.guild_id);}
        if(j.contains("channel_id")){j.at("channel_id").get_to(t.channel_id);}
        if(j.contains("member")){j.at("member").get_to(t.member);}
        if(j.contains("user")){j.at("user").get_to(t.user);}
        if(j.contains("token")){j.at("token").get_to(t.token);}
        if(j.contains("version")){j.at("version").get_to(t.version);}
        if(j.contains("message")){j.at("message").get_to(t.message);}
        if(j.contains("app_permissions")){j.at("app_permissions").get_to(t.app_permissions);}
        if(j.contains("locale")){j.at("locale").get_to(t.locale);}
        if(j.contains("guild_locale")){j.at("guild_locale").get_to(t.guild_locale);}
    }